

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Performance::anon_unknown_1::
RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::
iterate(RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
        *this)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  TestError *this_00;
  size_type sVar4;
  allocator<char> local_69;
  string local_68;
  UnmapFailureError *ex;
  reference local_30;
  SampleResult *currentSample;
  int local_20;
  int currentConfigNdx;
  int currentIteration;
  int unmapFailureThreshold;
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
  *this_local;
  
  currentConfigNdx = 3;
  local_20 = this->m_iterationNdx;
  _currentIteration = this;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->m_iterationOrder,(long)local_20);
  currentSample._4_4_ = *pvVar3;
  local_30 = std::
             vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult>_>
             ::operator[](&this->m_results,(long)currentSample._4_4_);
  (*(this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[5])(this,local_30);
  this->m_iterationNdx = this->m_iterationNdx + 1;
  if (this->m_numUnmapFailures < 4) {
    iVar1 = this->m_iterationNdx;
    sVar4 = std::vector<int,_std::allocator<int>_>::size(&this->m_iterationOrder);
    bVar2 = (int)sVar4 <= iVar1;
    if (bVar2) {
      (*(this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[6])(this,&this->m_results);
    }
    this_local._4_4_ = (IterateResult)!bVar2;
    return this_local._4_4_;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Got too many unmap errors",&local_69);
  tcu::TestError::TestError(this_00,&local_68);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

typename RenderCase<SampleType>::IterateResult RenderCase<SampleType>::iterate (void)
{
	const int		unmapFailureThreshold	= 3;
	const int		currentIteration		= m_iterationNdx;
	const int		currentConfigNdx		= m_iterationOrder[currentIteration];
	SampleResult&	currentSample			= m_results[currentConfigNdx];

	try
	{
		runSample(currentSample);
		++m_iterationNdx;
	}
	catch (const UnmapFailureError& ex)
	{
		DE_UNREF(ex);
		++m_numUnmapFailures;
	}

	if (m_numUnmapFailures > unmapFailureThreshold)
		throw tcu::TestError("Got too many unmap errors");

	if (m_iterationNdx < (int)m_iterationOrder.size())
		return CONTINUE;

	logAndSetTestResult(m_results);
	return STOP;
}